

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# OclBackend.cpp
# Opt level: O0

void __thiscall xmrig::OclBackend::setJob(OclBackend *this,Job *job)

{
  __normal_iterator<xmrig::OclLaunchData_*,_std::vector<xmrig::OclLaunchData,_std::allocator<xmrig::OclLaunchData>_>_>
  __last1;
  bool bVar1;
  uint uVar2;
  Config *this_00;
  ulong uVar3;
  vector<xmrig::OclLaunchData,_std::allocator<xmrig::OclLaunchData>_> *pvVar4;
  __normal_iterator<xmrig::OclLaunchData_*,_std::vector<xmrig::OclLaunchData,_std::allocator<xmrig::OclLaunchData>_>_>
  in_RDI;
  vector<xmrig::OclLaunchData,_std::allocator<xmrig::OclLaunchData>_> threads;
  OclConfig *cl;
  Job *in_stack_00000088;
  OclBackendPrivate *in_stack_00000090;
  OclPlatform *in_stack_00000098;
  Miner *in_stack_000000a0;
  OclConfig *in_stack_000000a8;
  vector<xmrig::OclLaunchData,_std::allocator<xmrig::OclLaunchData>_> *in_stack_ffffffffffffff78;
  vector<xmrig::OclLaunchData,_std::allocator<xmrig::OclLaunchData>_> *in_stack_ffffffffffffff88;
  __normal_iterator<xmrig::OclLaunchData_*,_std::vector<xmrig::OclLaunchData,_std::allocator<xmrig::OclLaunchData>_>_>
  __first2;
  undefined7 in_stack_ffffffffffffff98;
  undefined1 uVar5;
  vector<xmrig::OclLaunchData,_std::allocator<xmrig::OclLaunchData>_> local_30;
  OclLaunchData *local_18;
  
  this_00 = Base::config((Base *)**(undefined8 **)&(in_RDI._M_current)->cache);
  local_18 = (OclLaunchData *)Config::cl(this_00);
  bVar1 = OclConfig::isEnabled((OclConfig *)local_18);
  if (bVar1) {
    OclBackendPrivate::init
              (*(OclBackendPrivate **)&(in_RDI._M_current)->cache,(EVP_PKEY_CTX *)local_18);
  }
  uVar3 = (**(code **)((in_RDI._M_current)->ctx + 0x10))();
  if ((uVar3 & 1) == 0) {
    (**(code **)((in_RDI._M_current)->ctx + 0x58))();
  }
  else {
    __first2._M_current = local_18;
    Controller::miner((Controller *)**(undefined8 **)&(in_RDI._M_current)->cache);
    OclConfig::get(in_stack_000000a8,in_stack_000000a0,in_stack_00000098,
                   (vector<xmrig::OclDevice,_std::allocator<xmrig::OclDevice>_> *)in_stack_00000090)
    ;
    bVar1 = std::vector<xmrig::OclLaunchData,_std::allocator<xmrig::OclLaunchData>_>::empty
                      ((vector<xmrig::OclLaunchData,_std::allocator<xmrig::OclLaunchData>_> *)
                       __first2._M_current);
    uVar5 = false;
    if (!bVar1) {
      in_stack_ffffffffffffff88 =
           (vector<xmrig::OclLaunchData,_std::allocator<xmrig::OclLaunchData>_> *)
           std::vector<xmrig::OclLaunchData,_std::allocator<xmrig::OclLaunchData>_>::size
                     ((vector<xmrig::OclLaunchData,_std::allocator<xmrig::OclLaunchData>_> *)
                      (*(long *)&(in_RDI._M_current)->cache + 0x58));
      pvVar4 = (vector<xmrig::OclLaunchData,_std::allocator<xmrig::OclLaunchData>_> *)
               std::vector<xmrig::OclLaunchData,_std::allocator<xmrig::OclLaunchData>_>::size
                         (&local_30);
      uVar5 = false;
      if (in_stack_ffffffffffffff88 == pvVar4) {
        std::vector<xmrig::OclLaunchData,_std::allocator<xmrig::OclLaunchData>_>::begin
                  (in_stack_ffffffffffffff78);
        std::vector<xmrig::OclLaunchData,_std::allocator<xmrig::OclLaunchData>_>::end
                  (in_stack_ffffffffffffff78);
        std::vector<xmrig::OclLaunchData,_std::allocator<xmrig::OclLaunchData>_>::begin
                  (in_stack_ffffffffffffff78);
        __last1._M_current._7_1_ = uVar5;
        __last1._M_current._0_7_ = in_stack_ffffffffffffff98;
        uVar5 = std::
                equal<__gnu_cxx::__normal_iterator<xmrig::OclLaunchData*,std::vector<xmrig::OclLaunchData,std::allocator<xmrig::OclLaunchData>>>,__gnu_cxx::__normal_iterator<xmrig::OclLaunchData*,std::vector<xmrig::OclLaunchData,std::allocator<xmrig::OclLaunchData>>>>
                          (in_RDI,__last1,__first2);
      }
    }
    if ((bool)uVar5 == false) {
      bVar1 = std::vector<xmrig::OclLaunchData,_std::allocator<xmrig::OclLaunchData>_>::empty
                        ((vector<xmrig::OclLaunchData,_std::allocator<xmrig::OclLaunchData>_> *)
                         __first2._M_current);
      if (bVar1) {
        Log::print(WARNING,
                   "%s \x1b[1;31mdisabled\x1b[0m\x1b[0;33m (no suitable configuration found)\x1b[0m"
                   ,tag);
        (**(code **)((in_RDI._M_current)->ctx + 0x58))();
      }
      else {
        uVar2 = OclContext::init((OclContext *)(*(long *)&(in_RDI._M_current)->cache + 8),
                                 (EVP_PKEY_CTX *)(*(long *)&(in_RDI._M_current)->cache + 0x40));
        if ((uVar2 & 1) == 0) {
          Log::print(WARNING,
                     "%s \x1b[1;31mdisabled\x1b[0m\x1b[0;33m (OpenCL context unavailable)\x1b[0m",
                     tag);
          (**(code **)((in_RDI._M_current)->ctx + 0x58))();
        }
        else {
          (**(code **)((in_RDI._M_current)->ctx + 0x58))();
          std::vector<xmrig::OclLaunchData,_std::allocator<xmrig::OclLaunchData>_>::operator=
                    ((vector<xmrig::OclLaunchData,_std::allocator<xmrig::OclLaunchData>_> *)
                     __first2._M_current,in_stack_ffffffffffffff88);
          OclBackendPrivate::start(in_stack_00000090,in_stack_00000088);
        }
      }
    }
    std::vector<xmrig::OclLaunchData,_std::allocator<xmrig::OclLaunchData>_>::~vector
              ((vector<xmrig::OclLaunchData,_std::allocator<xmrig::OclLaunchData>_> *)
               __first2._M_current);
  }
  return;
}

Assistant:

void xmrig::OclBackend::setJob(const Job &job)
{
    const auto &cl = d_ptr->controller->config()->cl();
    if (cl.isEnabled()) {
        d_ptr->init(cl);
    }

    if (!isEnabled()) {
        return stop();
    }

    auto threads = cl.get(d_ptr->controller->miner(), d_ptr->platform, d_ptr->devices);
    if (!d_ptr->threads.empty() && d_ptr->threads.size() == threads.size() && std::equal(d_ptr->threads.begin(), d_ptr->threads.end(), threads.begin())) {
        return;
    }

    if (threads.empty()) {
        LOG_WARN("%s " RED_BOLD("disabled") YELLOW(" (no suitable configuration found)"), tag);

        return stop();
    }

    if (!d_ptr->context.init(d_ptr->devices, threads)) {
        LOG_WARN("%s " RED_BOLD("disabled") YELLOW(" (OpenCL context unavailable)"), tag);

        return stop();
    }

    stop();

    d_ptr->threads = std::move(threads);
    d_ptr->start(job);
}